

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.h
# Opt level: O0

void __thiscall Assimp::AC3DImporter::Material::Material(Material *this)

{
  Material *this_local;
  
  aiColor3D::aiColor3D(&this->rgb,0.6,0.6,0.6);
  aiColor3D::aiColor3D(&this->amb);
  aiColor3D::aiColor3D(&this->emis);
  aiColor3D::aiColor3D(&this->spec,1.0,1.0,1.0);
  this->shin = 0.0;
  this->trans = 0.0;
  std::__cxx11::string::string((string *)&this->name);
  return;
}

Assistant:

Material()
            :   rgb     (0.6f,0.6f,0.6f)
            ,   spec    (1.f,1.f,1.f)
            ,   shin    (0.f)
            ,   trans   (0.f)
        {}